

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_peeling.cpp
# Opt level: O2

pair<bool,_spvtools::opt::Loop_*> __thiscall
spvtools::opt::LoopPeelingPass::ProcessLoop(LoopPeelingPass *this,Loop *loop,CodeMetrics *loop_size)

{
  uint uVar1;
  size_type sVar2;
  uint uVar3;
  uint uVar4;
  bool bVar5;
  uint32_t uVar6;
  int iVar7;
  PeelDirection PVar8;
  uint uVar9;
  ScalarEvolutionAnalysis *pSVar10;
  BasicBlock *condition_block;
  Instruction *pIVar11;
  TypeManager *this_00;
  Type *pTVar12;
  undefined4 extraout_var;
  CFG *this_01;
  BasicBlock *pBVar13;
  Direction DVar14;
  ulong uVar15;
  undefined1 sign;
  uint uVar16;
  Loop *pLVar17;
  __node_base *p_Var18;
  pair<bool,_spvtools::opt::Loop_*> pVar19;
  uint local_114;
  Instruction *canonical_induction_variable;
  size_t iterations;
  PeelDirection local_fc;
  Loop *loop_local;
  undefined1 local_f0 [8];
  LoopPeelingInfo peel_info;
  LoopPeeling peeler;
  
  loop_local = loop;
  pSVar10 = IRContext::GetScalarEvolutionAnalysis((this->super_Pass).context_);
  condition_block = Loop::FindConditionBlock(loop);
  if ((condition_block == (BasicBlock *)0x0) ||
     (pIVar11 = Loop::FindConditionVariable(loop,condition_block), pIVar11 == (Instruction *)0x0)) {
    uVar15 = 0;
    pLVar17 = (Loop *)0x0;
    goto LAB_00515834;
  }
  iterations = 0;
  local_f0 = (undefined1  [8])loop_size;
  BasicBlock::tail((BasicBlock *)&peeler);
  pLVar17 = (Loop *)0x0;
  bVar5 = Loop::FindNumberOfIterations
                    (loop,pIVar11,(Instruction *)peeler.context_,&iterations,(int64_t *)0x0,
                     (int64_t *)0x0);
  uVar15 = 0;
  if ((!bVar5) || (iterations == 0)) goto LAB_00515834;
  canonical_induction_variable = (Instruction *)0x0;
  pBVar13 = loop->loop_header_;
  peeler.loop_utils_.context_ = (IRContext *)0x0;
  peeler.context_ = (IRContext *)::operator_new(0x18);
  (peeler.context_)->syntax_context_ = (spv_context)&canonical_induction_variable;
  *(ScalarEvolutionAnalysis **)&(peeler.context_)->grammar_ = pSVar10;
  ((peeler.context_)->grammar_).operandTable_ = (spv_operand_table)this;
  peeler.loop_utils_.loop_ =
       (Loop *)std::
               _Function_handler<bool_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/loop_peeling.cpp:652:44)>
               ::_M_invoke;
  peeler.loop_utils_.loop_desc_ =
       (LoopDescriptor *)
       std::
       _Function_handler<bool_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/loop_peeling.cpp:652:44)>
       ::_M_manager;
  BasicBlock::WhileEachPhiInst
            (pBVar13,(function<bool_(spvtools::opt::Instruction_*)> *)&peeler,false);
  if (peeler.loop_utils_.loop_desc_ != (LoopDescriptor *)0x0) {
    (*(code *)peeler.loop_utils_.loop_desc_)(&peeler,&peeler,3);
  }
  if (canonical_induction_variable == (Instruction *)0x0) {
    sign = false;
  }
  else {
    this_00 = IRContext::get_type_mgr((this->super_Pass).context_);
    uVar6 = Instruction::type_id(canonical_induction_variable);
    pTVar12 = analysis::TypeManager::GetType(this_00,uVar6);
    iVar7 = (*pTVar12->_vptr_Type[9])(pTVar12);
    sign = *(undefined1 *)(CONCAT44(extraout_var,iVar7) + 0x28);
  }
  InstructionBuilder::InstructionBuilder
            ((InstructionBuilder *)&peel_info,(this->super_Pass).context_,loop->loop_header_,
             kAnalysisInstrToBlockMapping|kAnalysisBegin);
  pIVar11 = InstructionBuilder::GetIntConstant<unsigned_int>
                      ((InstructionBuilder *)&peel_info,(uint)iterations,(bool)sign);
  LoopPeeling::LoopPeeling(&peeler,loop,pIVar11,canonical_induction_variable);
  bVar5 = LoopPeeling::CanPeelLoop(&peeler);
  pLVar17 = (Loop *)0x0;
  if (bVar5) {
    peel_info.context_ = loop->context_;
    peel_info.loop_max_iterations_ = iterations;
    p_Var18 = &(loop->loop_basic_blocks_)._M_h._M_before_begin;
    peel_info.loop_ = loop;
    peel_info.scev_analysis_ = pSVar10;
    uVar3 = 0;
    uVar4 = 0;
    while (uVar1 = uVar4, uVar16 = uVar3, p_Var18 = p_Var18->_M_nxt, p_Var18 != (__node_base *)0x0)
    {
      sVar2 = *(size_type *)(p_Var18 + 1);
      uVar6 = BasicBlock::id(condition_block);
      uVar3 = uVar16;
      uVar4 = uVar1;
      if ((uint32_t)sVar2 != uVar6) {
        this_01 = Pass::cfg(&this->super_Pass);
        pBVar13 = CFG::block(this_01,(uint32_t)sVar2);
        DVar14 = LoopPeelingInfo::GetPeelingInfo(&peel_info,pBVar13);
        PVar8 = DVar14.first;
        if (PVar8 != kNone) {
          uVar9 = DVar14.second;
          if (PVar8 == kAfter) {
            uVar3 = uVar9;
            if (uVar9 < uVar16) {
              uVar3 = uVar16;
            }
          }
          else {
            if (PVar8 != kBefore) {
              __assert_fail("direction == PeelDirection::kAfter",
                            "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/loop_peeling.cpp"
                            ,0x2c9,
                            "std::pair<bool, Loop *> spvtools::opt::LoopPeelingPass::ProcessLoop(Loop *, CodeMetrics *)"
                           );
            }
            uVar4 = uVar9;
            if (uVar9 < uVar1) {
              uVar4 = uVar1;
            }
          }
        }
      }
    }
    local_114 = uVar16;
    if (((uVar16 <= uVar1 || uVar16 == 0) && (local_114 = uVar1, uVar1 == 0)) ||
       (uVar15 = (ulong)local_114 * *(size_t *)((long)local_f0 + 0x38),
       code_grow_threshold_ <= uVar15 && uVar15 - code_grow_threshold_ != 0)) {
      uVar15 = 0;
    }
    else {
      *(ulong *)((long)local_f0 + 0x38) = uVar15;
      if ((uVar16 <= uVar1 || uVar16 == 0) && uVar1 != 0) {
        LoopPeeling::PeelBefore(&peeler,local_114);
        pLVar17 = peeler.loop_;
        uVar1 = uVar16;
        if ((vector<std::tuple<spvtools::opt::Loop_const*,spvtools::opt::LoopPeelingPass::PeelDirection,unsigned_int>,std::allocator<std::tuple<spvtools::opt::Loop_const*,spvtools::opt::LoopPeelingPass::PeelDirection,unsigned_int>>>
             *)this->stats_ !=
            (vector<std::tuple<spvtools::opt::Loop_const*,spvtools::opt::LoopPeelingPass::PeelDirection,unsigned_int>,std::allocator<std::tuple<spvtools::opt::Loop_const*,spvtools::opt::LoopPeelingPass::PeelDirection,unsigned_int>>>
             *)0x0) {
          local_fc = kBefore;
          std::
          vector<std::tuple<spvtools::opt::Loop_const*,spvtools::opt::LoopPeelingPass::PeelDirection,unsigned_int>,std::allocator<std::tuple<spvtools::opt::Loop_const*,spvtools::opt::LoopPeelingPass::PeelDirection,unsigned_int>>>
          ::
          emplace_back<spvtools::opt::Loop*&,spvtools::opt::LoopPeelingPass::PeelDirection,unsigned_int&>
                    ((vector<std::tuple<spvtools::opt::Loop_const*,spvtools::opt::LoopPeelingPass::PeelDirection,unsigned_int>,std::allocator<std::tuple<spvtools::opt::Loop_const*,spvtools::opt::LoopPeelingPass::PeelDirection,unsigned_int>>>
                      *)this->stats_,&loop_local,&local_fc,&local_114);
          pLVar17 = peeler.loop_;
        }
      }
      else {
        LoopPeeling::PeelAfter(&peeler,local_114);
        pLVar17 = peeler.cloned_loop_;
        if ((vector<std::tuple<spvtools::opt::Loop_const*,spvtools::opt::LoopPeelingPass::PeelDirection,unsigned_int>,std::allocator<std::tuple<spvtools::opt::Loop_const*,spvtools::opt::LoopPeelingPass::PeelDirection,unsigned_int>>>
             *)this->stats_ !=
            (vector<std::tuple<spvtools::opt::Loop_const*,spvtools::opt::LoopPeelingPass::PeelDirection,unsigned_int>,std::allocator<std::tuple<spvtools::opt::Loop_const*,spvtools::opt::LoopPeelingPass::PeelDirection,unsigned_int>>>
             *)0x0) {
          local_fc = kAfter;
          std::
          vector<std::tuple<spvtools::opt::Loop_const*,spvtools::opt::LoopPeelingPass::PeelDirection,unsigned_int>,std::allocator<std::tuple<spvtools::opt::Loop_const*,spvtools::opt::LoopPeelingPass::PeelDirection,unsigned_int>>>
          ::
          emplace_back<spvtools::opt::Loop*&,spvtools::opt::LoopPeelingPass::PeelDirection,unsigned_int&>
                    ((vector<std::tuple<spvtools::opt::Loop_const*,spvtools::opt::LoopPeelingPass::PeelDirection,unsigned_int>,std::allocator<std::tuple<spvtools::opt::Loop_const*,spvtools::opt::LoopPeelingPass::PeelDirection,unsigned_int>>>
                      *)this->stats_,&loop_local,&local_fc,&local_114);
          pLVar17 = peeler.cloned_loop_;
        }
      }
      uVar15 = CONCAT71((int7)((ulong)&peel_info >> 8),1);
      if (uVar1 != 0) goto LAB_00515827;
    }
    pLVar17 = (Loop *)0x0;
  }
  else {
    uVar15 = 0;
  }
LAB_00515827:
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&peeler.exit_value_._M_h);
LAB_00515834:
  pVar19._0_8_ = uVar15 & 0xffffffff;
  pVar19.second = pLVar17;
  return pVar19;
}

Assistant:

std::pair<bool, Loop*> LoopPeelingPass::ProcessLoop(Loop* loop,
                                                    CodeMetrics* loop_size) {
  ScalarEvolutionAnalysis* scev_analysis =
      context()->GetScalarEvolutionAnalysis();
  // Default values for bailing out.
  std::pair<bool, Loop*> bail_out{false, nullptr};

  BasicBlock* exit_block = loop->FindConditionBlock();
  if (!exit_block) {
    return bail_out;
  }

  Instruction* exiting_iv = loop->FindConditionVariable(exit_block);
  if (!exiting_iv) {
    return bail_out;
  }
  size_t iterations = 0;
  if (!loop->FindNumberOfIterations(exiting_iv, &*exit_block->tail(),
                                    &iterations)) {
    return bail_out;
  }
  if (!iterations) {
    return bail_out;
  }

  Instruction* canonical_induction_variable = nullptr;

  loop->GetHeaderBlock()->WhileEachPhiInst([&canonical_induction_variable,
                                            scev_analysis,
                                            this](Instruction* insn) {
    if (const SERecurrentNode* iv =
            scev_analysis->AnalyzeInstruction(insn)->AsSERecurrentNode()) {
      const SEConstantNode* offset = iv->GetOffset()->AsSEConstantNode();
      const SEConstantNode* coeff = iv->GetCoefficient()->AsSEConstantNode();
      if (offset && coeff && offset->FoldToSingleValue() == 0 &&
          coeff->FoldToSingleValue() == 1) {
        if (context()->get_type_mgr()->GetType(insn->type_id())->AsInteger()) {
          canonical_induction_variable = insn;
          return false;
        }
      }
    }
    return true;
  });

  bool is_signed = canonical_induction_variable
                       ? context()
                             ->get_type_mgr()
                             ->GetType(canonical_induction_variable->type_id())
                             ->AsInteger()
                             ->IsSigned()
                       : false;

  LoopPeeling peeler(
      loop,
      InstructionBuilder(
          context(), loop->GetHeaderBlock(),
          IRContext::kAnalysisDefUse | IRContext::kAnalysisInstrToBlockMapping)
          .GetIntConstant<uint32_t>(static_cast<uint32_t>(iterations),
                                    is_signed),
      canonical_induction_variable);

  if (!peeler.CanPeelLoop()) {
    return bail_out;
  }

  // For each basic block in the loop, check if it can be peeled. If it
  // can, get the direction (before/after) and by which factor.
  LoopPeelingInfo peel_info(loop, iterations, scev_analysis);

  uint32_t peel_before_factor = 0;
  uint32_t peel_after_factor = 0;

  for (uint32_t block : loop->GetBlocks()) {
    if (block == exit_block->id()) {
      continue;
    }
    BasicBlock* bb = cfg()->block(block);
    PeelDirection direction;
    uint32_t factor;
    std::tie(direction, factor) = peel_info.GetPeelingInfo(bb);

    if (direction == PeelDirection::kNone) {
      continue;
    }
    if (direction == PeelDirection::kBefore) {
      peel_before_factor = std::max(peel_before_factor, factor);
    } else {
      assert(direction == PeelDirection::kAfter);
      peel_after_factor = std::max(peel_after_factor, factor);
    }
  }
  PeelDirection direction = PeelDirection::kNone;
  uint32_t factor = 0;

  // Find which direction we should peel.
  if (peel_before_factor) {
    factor = peel_before_factor;
    direction = PeelDirection::kBefore;
  }
  if (peel_after_factor) {
    if (peel_before_factor < peel_after_factor) {
      // Favor a peel after here and give the peel before another shot later.
      factor = peel_after_factor;
      direction = PeelDirection::kAfter;
    }
  }

  // Do the peel if we can.
  if (direction == PeelDirection::kNone) return bail_out;

  // This does not take into account branch elimination opportunities and
  // the unrolling. It assumes the peeled loop will be unrolled as well.
  if (factor * loop_size->roi_size_ > code_grow_threshold_) {
    return bail_out;
  }
  loop_size->roi_size_ *= factor;

  // Find if a loop should be peeled again.
  Loop* extra_opportunity = nullptr;

  if (direction == PeelDirection::kBefore) {
    peeler.PeelBefore(factor);
    if (stats_) {
      stats_->peeled_loops_.emplace_back(loop, PeelDirection::kBefore, factor);
    }
    if (peel_after_factor) {
      // We could have peeled after, give it another try.
      extra_opportunity = peeler.GetOriginalLoop();
    }
  } else {
    peeler.PeelAfter(factor);
    if (stats_) {
      stats_->peeled_loops_.emplace_back(loop, PeelDirection::kAfter, factor);
    }
    if (peel_before_factor) {
      // We could have peeled before, give it another try.
      extra_opportunity = peeler.GetClonedLoop();
    }
  }

  return {true, extra_opportunity};
}